

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

void __thiscall
re2::Prog::ComputeHints
          (Prog *this,vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *flat,int begin,
          int end)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  bool bVar4;
  pointer pIVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  int colors [256];
  Bitmap256 local_478;
  long local_450;
  long local_448;
  pointer local_440;
  int aiStack_438 [255];
  int local_3c;
  
  local_478.words_[2] = 0;
  local_478.words_[3] = 0;
  local_478.words_[0] = 0;
  local_478.words_[1] = 0;
  if (begin <= end) {
    lVar12 = (long)end;
    lVar11 = (long)begin;
    bVar6 = false;
    local_448 = lVar12;
    local_450 = lVar11;
    lVar17 = lVar12;
    do {
      iVar16 = (int)lVar17;
      if ((lVar17 == lVar12) ||
         (local_440 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                      _M_impl.super__Vector_impl_data._M_start,
         (local_440[lVar17].out_opcode_ & 7) != 2)) {
        if (bVar6) {
          local_478.words_[0] = 0;
          local_478.words_[1] = 0;
          local_478.words_[2] = 0;
          local_478.words_[3] = 0x8000000000000000;
        }
        else {
          local_478.words_[3] = local_478.words_[3] | 0x8000000000000000;
        }
        local_3c = iVar16;
        bVar6 = false;
      }
      else {
        bVar1 = local_440[lVar17].field_1.field_3.lo_;
        bVar2 = local_440[lVar17].field_1.field_3.hi_;
        uVar15 = (uint)bVar1;
        if (bVar1 != 0) {
          uVar13 = bVar1 - 1;
          if ((local_478.words_[uVar13 >> 6] >> ((ulong)uVar13 & 0x3f) & 1) == 0) {
            local_478.words_[uVar13 >> 6] =
                 local_478.words_[uVar13 >> 6] | 1L << ((byte)uVar13 & 0x3f);
            iVar7 = Bitmap256::FindNextSetBit(&local_478,uVar15);
            aiStack_438[uVar13] = aiStack_438[iVar7];
          }
        }
        iVar7 = end;
        uVar13 = uVar15;
        pIVar5 = local_440;
        if ((local_478.words_[bVar2 >> 6] >> ((ulong)bVar2 & 0x3f) & 1) == 0) {
          local_478.words_[bVar2 >> 6] = local_478.words_[bVar2 >> 6] | 1L << (bVar2 & 0x3f);
          iVar8 = Bitmap256::FindNextSetBit(&local_478,bVar2 + 1);
          aiStack_438[bVar2] = aiStack_438[iVar8];
          pIVar5 = local_440;
        }
        do {
          uVar14 = (uint)bVar2;
          if (0xff < (int)uVar13) break;
          uVar9 = Bitmap256::FindNextSetBit(&local_478,uVar13);
          if (aiStack_438[(int)uVar9] < iVar7) {
            iVar7 = aiStack_438[(int)uVar9];
          }
          aiStack_438[(int)uVar9] = iVar16;
          uVar13 = uVar9 + 1;
        } while (uVar9 != uVar14);
        uVar3 = pIVar5[lVar17].field_1.field_3.hint_foldcase_;
        if (((0x60 < bVar2) && (bVar1 < 0x7b)) && ((uVar3 & 1) != 0)) {
          if (bVar1 < 0x62) {
            uVar15 = 0x61;
          }
          if (0x79 < uVar14) {
            uVar14 = 0x7a;
          }
          if (uVar15 <= uVar14) {
            iVar8 = uVar15 - 0x20;
            uVar15 = uVar15 - 0x21;
            if ((local_478.words_[uVar15 >> 6] >> ((ulong)uVar15 & 0x3f) & 1) == 0) {
              local_478.words_[uVar15 >> 6] =
                   local_478.words_[uVar15 >> 6] | 1L << ((byte)uVar15 & 0x3f);
              iVar10 = Bitmap256::FindNextSetBit(&local_478,iVar8);
              aiStack_438[uVar15] = aiStack_438[iVar10];
            }
            if ((local_478.words_[1] >> ((ulong)(uVar14 - 0x60 & 0xff) & 0x3f) & 1) == 0) {
              local_478.words_[1] = local_478.words_[1] | 1L << ((byte)(uVar14 - 0x60) & 0x3f);
              iVar10 = Bitmap256::FindNextSetBit(&local_478,uVar14 - 0x1f);
              aiStack_438[uVar14 - 0x20] = aiStack_438[iVar10];
            }
            do {
              if (0xff < iVar8) break;
              uVar15 = Bitmap256::FindNextSetBit(&local_478,iVar8);
              if (aiStack_438[(int)uVar15] < iVar7) {
                iVar7 = aiStack_438[(int)uVar15];
              }
              aiStack_438[(int)uVar15] = iVar16;
              iVar8 = uVar15 + 1;
            } while (uVar15 != uVar14 - 0x20);
          }
        }
        bVar6 = true;
        lVar11 = local_450;
        lVar12 = local_448;
        if (iVar7 != end) {
          iVar7 = iVar7 - iVar16;
          if (0x7ffe < iVar7) {
            iVar7 = 0x7fff;
          }
          local_440[lVar17].field_1.field_3.hint_foldcase_ = uVar3 | (short)iVar7 * 2;
        }
      }
      bVar4 = lVar11 < lVar17;
      lVar17 = lVar17 + -1;
    } while (bVar4);
  }
  return;
}

Assistant:

void Prog::Inst::InitAlt(uint32_t out, uint32_t out1) {
  DCHECK_EQ(out_opcode_, 0);
  set_out_opcode(out, kInstAlt);
  out1_ = out1;
}